

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O1

void __thiscall tcu::TestNode::~TestNode(TestNode *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TestNode::~TestNode (void)
{
	TestNode::deinit();
}